

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O3

NumberParserImpl *
icu_63::numparse::impl::NumberParserImpl::createParserFromProperties
          (DecimalFormatProperties *properties,DecimalFormatSymbols *symbols,bool parseCurrency,
          UErrorCode *status)

{
  anon_struct_3968_13_3a90479f_for_fLocalMatchers *this;
  AffixTokenMatcherWarehouse *this_00;
  AffixMatcherWarehouse *this_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  CurrencyPluralInfo *cpi;
  byte bVar4;
  UBool UVar5;
  int16_t iVar6;
  int iVar7;
  UnicodeSet *this_02;
  long lVar8;
  _func_int **pp_Var9;
  long lVar10;
  uint uVar11;
  int power;
  DecimalMatcher *p;
  ScientificMatcher *p_00;
  CurrencyPluralInfoAffixProvider *this_03;
  UnicodeString *src;
  long lVar12;
  long lVar13;
  AffixPatternProvider *this_04;
  uint uVar14;
  MaybeStackArray<char16_t,_4> *this_05;
  UnicodeString *this_06;
  long lVar15;
  Scale multiplier;
  CurrencyUnit currency;
  UnicodeString padString;
  PropertiesAffixPatternProvider localPAPP;
  CurrencySymbols currencySymbols;
  Locale locale;
  AffixTokenMatcherSetupData affixSetupData;
  CurrencyPluralInfoAffixProvider localCPIAP;
  NumberParserImpl *local_f50;
  Grouper local_f28;
  _func_int **local_f18;
  _func_int **local_f10;
  Scale local_f08;
  Scale local_ef0;
  CurrencyUnit local_ed8;
  CurrencyUnit local_eb8;
  UnicodeString local_e98;
  undefined1 local_e58 [8];
  undefined1 local_e50 [64];
  undefined **local_e10;
  bool local_e08 [8];
  UnicodeString local_e00;
  undefined1 auStack_dc0 [32];
  LocalPointer<const_icu_63::UnicodeSet> local_da0;
  LocalArray<const_icu_63::UnicodeString> local_d98 [7];
  LocalPointer<const_icu_63::UnicodeSet> local_d60;
  NumberParseMatcher local_d58;
  LocalArray<const_icu_63::UnicodeString> local_d50;
  UnicodeString local_d48;
  UnicodeString local_d08 [3];
  UnicodeString local_c40;
  UnicodeString local_c00;
  CharString local_bc0;
  MaybeStackArray<char16_t,_4> local_b70 [19];
  undefined1 local_9a0 [16];
  undefined2 local_990;
  UnicodeString local_958;
  UnicodeString local_918;
  UnicodeString local_8d8;
  undefined1 local_898;
  CurrencySymbols local_890;
  Locale local_7a8;
  undefined1 local_6c8 [40];
  CurrencyPluralInfoAffixProvider local_6a0;
  size_t size;
  
  Locale::Locale(&local_7a8,&symbols->locale);
  local_9a0._0_8_ = &PTR__PropertiesAffixPatternProvider_003d73e0;
  local_9a0._8_8_ = &PTR__UnicodeString_003e4fd8;
  local_990 = 2;
  local_958.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
  local_958.fUnion.fStackFields.fLengthAndFlags = 2;
  local_918.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
  local_918.fUnion.fStackFields.fLengthAndFlags = 2;
  local_8d8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
  local_8d8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_898 = 1;
  local_6a0.super_AffixPatternProvider._vptr_AffixPatternProvider =
       (_func_int **)&PTR__CurrencyPluralInfoAffixProvider_003d7480;
  lVar8 = 0x110;
  do {
    *(undefined ***)(local_7a8.language + lVar8 + -8) =
         &PTR__PropertiesAffixPatternProvider_003d73e0;
    *(undefined ***)(local_7a8.language + lVar8) = &PTR__UnicodeString_003e4fd8;
    (local_7a8.language + lVar8 + 8)[0] = '\x02';
    (local_7a8.language + lVar8 + 8)[1] = '\0';
    *(undefined ***)(local_7a8.fullNameBuffer + lVar8 + 0x18) = &PTR__UnicodeString_003e4fd8;
    (local_7a8.fullNameBuffer + lVar8 + 0x20)[0] = '\x02';
    (local_7a8.fullNameBuffer + lVar8 + 0x20)[1] = '\0';
    *(undefined ***)(local_7a8.fullNameBuffer + lVar8 + 0x58) = &PTR__UnicodeString_003e4fd8;
    (local_7a8.fullNameBuffer + lVar8 + 0x60)[0] = '\x02';
    (local_7a8.fullNameBuffer + lVar8 + 0x60)[1] = '\0';
    *(undefined ***)(local_6c8 + lVar8 + -0x18) = &PTR__UnicodeString_003e4fd8;
    *(undefined2 *)(local_6c8 + lVar8 + -0x10) = 2;
    *(undefined1 *)((long)local_6a0.affixesByPlural + lVar8 + -8) = 1;
    lVar8 = lVar8 + 0x110;
  } while (lVar8 != 0x770);
  local_6a0.fBogus = true;
  cpi = (properties->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr
  ;
  if (cpi == (CurrencyPluralInfo *)0x0) {
    this_03 = (CurrencyPluralInfoAffixProvider *)local_9a0;
    icu_63::number::impl::PropertiesAffixPatternProvider::setTo
              ((PropertiesAffixPatternProvider *)this_03,properties,status);
  }
  else {
    this_03 = &local_6a0;
    icu_63::number::impl::CurrencyPluralInfoAffixProvider::setTo(this_03,cpi,properties,status);
  }
  local_f10 = (_func_int **)&PTR__PropertiesAffixPatternProvider_003d73e0;
  if (U_ZERO_ERROR < *status) {
    local_f50 = (NumberParserImpl *)0x0;
    goto LAB_0026ef9a;
  }
  icu_63::number::impl::resolveCurrency(&local_eb8,properties,&local_7a8,status);
  CurrencyUnit::CurrencyUnit(&local_ed8,&local_eb8);
  icu_63::number::impl::CurrencySymbols::CurrencySymbols
            (&local_890,&local_ed8,&local_7a8,symbols,status);
  CurrencyUnit::~CurrencyUnit(&local_ed8);
  bVar4 = (properties->parseMode).fValue == PARSE_MODE_STRICT | (properties->parseMode).fNull;
  local_f28 = icu_63::number::impl::Grouper::forProperties(properties);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar1 = properties->parseCaseSensitive;
    bVar2 = properties->parseIntegerOnly;
    bVar3 = properties->signAlwaysShown;
    iVar6 = icu_63::number::impl::Grouper::getPrimary(&local_f28);
    uVar14 = bVar1 ^ 1;
    uVar11 = uVar14 + 0x10;
    if (bVar2 == false) {
      uVar11 = uVar14;
    }
    uVar14 = uVar11 + 0x400;
    if (bVar3 == false) {
      uVar14 = uVar11;
    }
    uVar11 = 0x80;
    if (bVar4 != 0) {
      uVar11 = 0x30c;
    }
    uVar11 = uVar11 | uVar14;
    size = (size_t)uVar11;
    uVar14 = uVar11 | 0x20;
    if (0 < iVar6) {
      uVar14 = uVar11;
    }
    if (parseCurrency) {
LAB_0026e4ee:
      uVar14 = uVar14 | 2;
    }
    else {
      iVar7 = (*(this_03->super_AffixPatternProvider)._vptr_AffixPatternProvider[5])(this_03);
      if ((char)iVar7 != '\0') goto LAB_0026e4ee;
    }
    uVar11 = uVar14 | 0x2000;
    if (parseCurrency) {
      uVar11 = uVar14;
    }
    local_f50 = (NumberParserImpl *)UMemory::operator_new((UMemory *)0x1040,size);
    if (local_f50 != (NumberParserImpl *)0x0) {
      NumberParserImpl(local_f50,uVar11);
    }
    IgnorablesMatcher::IgnorablesMatcher
              ((IgnorablesMatcher *)local_e58,(uint)bVar4 + DEFAULT_IGNORABLES);
    this = &local_f50->fLocalMatchers;
    UnicodeString::moveFrom
              (&(local_f50->fLocalMatchers).ignorables.super_SymbolMatcher.fString,
               (UnicodeString *)local_e50);
    (local_f50->fLocalMatchers).ignorables.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
    local_f18 = (_func_int **)&PTR__SymbolMatcher_003d7ea8;
    local_e58 = (undefined1  [8])&PTR__SymbolMatcher_003d7ea8;
    UnicodeString::~UnicodeString((UnicodeString *)local_e50);
    local_6c8._0_8_ = &local_890;
    local_6c8._24_8_ = &local_7a8;
    local_6c8._8_8_ = symbols;
    local_6c8._16_8_ = this;
    local_6c8._32_4_ = uVar11;
    AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
              ((AffixTokenMatcherWarehouse *)local_e58,(AffixTokenMatcherSetupData *)local_6c8);
    this_00 = &(local_f50->fLocalMatchers).affixTokenMatcherWarehouse;
    AffixTokenMatcherWarehouse::operator=(this_00,(AffixTokenMatcherWarehouse *)local_e58);
    AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse((AffixTokenMatcherWarehouse *)local_e58)
    ;
    AffixMatcherWarehouse::AffixMatcherWarehouse((AffixMatcherWarehouse *)local_e58,this_00);
    this_01 = &(local_f50->fLocalMatchers).affixMatcherWarehouse;
    AffixMatcherWarehouse::operator=(this_01,(AffixMatcherWarehouse *)local_e58);
    lVar8 = -0x1e0;
    this_05 = local_b70;
    do {
      *(undefined ***)(this_05[-3].stackArray + 1) = &PTR__AffixPatternMatcher_003d7db0;
      MaybeStackArray<char16_t,_4>::~MaybeStackArray(this_05);
      *(undefined ***)(this_05[-3].stackArray + 1) = &PTR__ArraySeriesMatcher_003d8ed8;
      MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
                ((MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *)
                 (this_05 + -2));
      this_05 = (MaybeStackArray<char16_t,_4> *)(this_05[-4].stackArray + 1);
      lVar8 = lVar8 + 0x50;
    } while (lVar8 != 0);
    AffixMatcherWarehouse::createAffixMatchers
              (this_01,&this_03->super_AffixPatternProvider,(MutableMatcherCollection *)local_f50,
               &this->ignorables,uVar11,status);
    pp_Var9 = local_f18;
    if (parseCurrency) {
LAB_0026e698:
      CombinedCurrencyMatcher::CombinedCurrencyMatcher
                ((CombinedCurrencyMatcher *)local_e58,&local_890,symbols,uVar11,status);
      *(ulong *)(local_f50->fLocalMatchers).currency.fCurrencyCode =
           CONCAT71(local_e50._1_7_,local_e50[0]);
      UnicodeString::moveFrom
                (&(local_f50->fLocalMatchers).currency.fCurrency1,(UnicodeString *)(local_e50 + 8));
      UnicodeString::moveFrom
                (&(local_f50->fLocalMatchers).currency.fCurrency2,(UnicodeString *)local_e08);
      (local_f50->fLocalMatchers).currency.fUseFullCurrencyData =
           (bool)local_e00.fUnion.fStackFields.fBuffer[0x17]._0_1_;
      this_06 = (UnicodeString *)&(local_f50->fLocalMatchers).currency.field_0x98;
      lVar8 = 6;
      src = (UnicodeString *)auStack_dc0;
      do {
        UnicodeString::moveFrom(this_06,src);
        src = src + 1;
        this_06 = this_06 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      UnicodeString::moveFrom(&(local_f50->fLocalMatchers).currency.afterPrefixInsert,&local_c40);
      UnicodeString::moveFrom(&(local_f50->fLocalMatchers).currency.beforeSuffixInsert,&local_c00);
      CharString::operator=(&(local_f50->fLocalMatchers).currency.fLocaleName,&local_bc0);
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (local_f50,&(local_f50->fLocalMatchers).currency);
      local_e58 = (undefined1  [8])&PTR__CombinedCurrencyMatcher_003d8fe0;
      MaybeStackArray<char,_40>::~MaybeStackArray(&local_bc0.buffer);
      UnicodeString::~UnicodeString(&local_c00);
      UnicodeString::~UnicodeString(&local_c40);
      lVar8 = 0x1d8;
      do {
        UnicodeString::~UnicodeString((UnicodeString *)(local_e58 + lVar8));
        lVar8 = lVar8 + -0x40;
      } while (lVar8 != 0x58);
      UnicodeString::~UnicodeString((UnicodeString *)local_e08);
      UnicodeString::~UnicodeString((UnicodeString *)(local_e50 + 8));
      pp_Var9 = local_f18;
    }
    else {
      iVar7 = (*(this_03->super_AffixPatternProvider)._vptr_AffixPatternProvider[5])(this_03);
      if ((char)iVar7 != '\0') goto LAB_0026e698;
    }
    if (bVar4 == 0) {
      iVar7 = (*(this_03->super_AffixPatternProvider)._vptr_AffixPatternProvider[9])
                        (this_03,0xfffffffd,status);
      if ((char)iVar7 != '\0') {
        PercentMatcher::PercentMatcher((PercentMatcher *)local_e58,symbols);
        UnicodeString::moveFrom
                  (&(local_f50->fLocalMatchers).percent.super_SymbolMatcher.fString,
                   (UnicodeString *)local_e50);
        (local_f50->fLocalMatchers).percent.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
        (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                  (local_f50,&(local_f50->fLocalMatchers).percent);
        local_e58 = (undefined1  [8])pp_Var9;
        UnicodeString::~UnicodeString((UnicodeString *)local_e50);
      }
      iVar7 = (*(this_03->super_AffixPatternProvider)._vptr_AffixPatternProvider[9])
                        (this_03,0xfffffffc,status);
      if ((char)iVar7 != '\0') {
        PermilleMatcher::PermilleMatcher((PermilleMatcher *)local_e58,symbols);
        UnicodeString::moveFrom
                  (&(local_f50->fLocalMatchers).permille.super_SymbolMatcher.fString,
                   (UnicodeString *)local_e50);
        (local_f50->fLocalMatchers).permille.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
        (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                  (local_f50,&(local_f50->fLocalMatchers).permille);
        local_e58 = (undefined1  [8])pp_Var9;
        UnicodeString::~UnicodeString((UnicodeString *)local_e50);
      }
      PlusSignMatcher::PlusSignMatcher((PlusSignMatcher *)local_e58,symbols,false);
      UnicodeString::moveFrom
                (&(local_f50->fLocalMatchers).plusSign.super_SymbolMatcher.fString,
                 (UnicodeString *)local_e50);
      (local_f50->fLocalMatchers).plusSign.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
      (local_f50->fLocalMatchers).plusSign.fAllowTrailing = local_e08[0];
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (local_f50,&(local_f50->fLocalMatchers).plusSign);
      local_e58 = (undefined1  [8])pp_Var9;
      UnicodeString::~UnicodeString((UnicodeString *)local_e50);
      MinusSignMatcher::MinusSignMatcher((MinusSignMatcher *)local_e58,symbols,false);
      UnicodeString::moveFrom
                (&(local_f50->fLocalMatchers).minusSign.super_SymbolMatcher.fString,
                 (UnicodeString *)local_e50);
      (local_f50->fLocalMatchers).minusSign.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
      (local_f50->fLocalMatchers).minusSign.fAllowTrailing = local_e08[0];
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (local_f50,&(local_f50->fLocalMatchers).minusSign);
      local_e58 = (undefined1  [8])pp_Var9;
      UnicodeString::~UnicodeString((UnicodeString *)local_e50);
    }
    NanMatcher::NanMatcher((NanMatcher *)local_e58,symbols);
    UnicodeString::moveFrom
              (&(local_f50->fLocalMatchers).nan.super_SymbolMatcher.fString,
               (UnicodeString *)local_e50);
    (local_f50->fLocalMatchers).nan.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
    (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
              (local_f50,&(local_f50->fLocalMatchers).nan);
    local_e58 = (undefined1  [8])pp_Var9;
    UnicodeString::~UnicodeString((UnicodeString *)local_e50);
    InfinityMatcher::InfinityMatcher((InfinityMatcher *)local_e58,symbols);
    UnicodeString::moveFrom
              (&(local_f50->fLocalMatchers).infinity.super_SymbolMatcher.fString,
               (UnicodeString *)local_e50);
    (local_f50->fLocalMatchers).infinity.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
    (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
              (local_f50,&(local_f50->fLocalMatchers).infinity);
    local_e58 = (undefined1  [8])pp_Var9;
    UnicodeString::~UnicodeString((UnicodeString *)local_e50);
    UnicodeString::UnicodeString(&local_e98,&properties->padString);
    if ((local_e98.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0) {
      this_02 = SymbolMatcher::getSet((SymbolMatcher *)this);
      UVar5 = UnicodeSet::contains(this_02,&local_e98);
      if (UVar5 == '\0') {
        PaddingMatcher::PaddingMatcher((PaddingMatcher *)local_e58,&local_e98);
        UnicodeString::moveFrom
                  (&(local_f50->fLocalMatchers).padding.super_SymbolMatcher.fString,
                   (UnicodeString *)local_e50);
        (local_f50->fLocalMatchers).padding.super_SymbolMatcher.fUniSet = (UnicodeSet *)local_e10;
        (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                  (local_f50,&(local_f50->fLocalMatchers).padding);
        local_e58 = (undefined1  [8])pp_Var9;
        UnicodeString::~UnicodeString((UnicodeString *)local_e50);
      }
    }
    (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(local_f50,this)
    ;
    DecimalMatcher::DecimalMatcher((DecimalMatcher *)local_e58,symbols,&local_f28,uVar11);
    p = &(local_f50->fLocalMatchers).decimal;
    (local_f50->fLocalMatchers).decimal.requireGroupingMatch = local_e50[0];
    (local_f50->fLocalMatchers).decimal.groupingDisabled = (bool)(char)local_e50._1_7_;
    (local_f50->fLocalMatchers).decimal.integerOnly = (bool)SUB71(local_e50._1_7_,1);
    (local_f50->fLocalMatchers).decimal.field_0xb = SUB71(local_e50._1_7_,2);
    (local_f50->fLocalMatchers).decimal.grouping1 = SUB72(local_e50._1_7_,3);
    (local_f50->fLocalMatchers).decimal.grouping2 = SUB72(local_e50._1_7_,5);
    UnicodeString::moveFrom
              (&(local_f50->fLocalMatchers).decimal.groupingSeparator,
               (UnicodeString *)(local_e50 + 8));
    UnicodeString::moveFrom
              (&(local_f50->fLocalMatchers).decimal.decimalSeparator,(UnicodeString *)local_e08);
    (local_f50->fLocalMatchers).decimal.groupingUniSet =
         (UnicodeSet *)
         CONCAT71(local_e00.fUnion._49_7_,local_e00.fUnion.fStackFields.fBuffer[0x17]._0_1_);
    (local_f50->fLocalMatchers).decimal.decimalUniSet = (UnicodeSet *)auStack_dc0._0_8_;
    (local_f50->fLocalMatchers).decimal.separatorSet = (UnicodeSet *)auStack_dc0._8_8_;
    (local_f50->fLocalMatchers).decimal.leadSet = (UnicodeSet *)auStack_dc0._16_8_;
    LocalPointer<const_icu_63::UnicodeSet>::moveFrom
              (&(local_f50->fLocalMatchers).decimal.fLocalDecimalUniSet,
               (LocalPointer<const_icu_63::UnicodeSet> *)(auStack_dc0 + 0x18));
    LocalPointer<const_icu_63::UnicodeSet>::moveFrom
              (&(local_f50->fLocalMatchers).decimal.fLocalSeparatorSet,&local_da0);
    LocalArray<const_icu_63::UnicodeString>::moveFrom
              (&(local_f50->fLocalMatchers).decimal.fLocalDigitStrings,local_d98);
    (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(local_f50);
    local_e58 = (undefined1  [8])&PTR__DecimalMatcher_003d9060;
    LocalArray<const_icu_63::UnicodeString>::~LocalArray(local_d98);
    if (local_da0.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet
                ((UnicodeSet *)local_da0.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr);
    }
    UMemory::operator_delete
              ((UMemory *)local_da0.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr,p);
    if ((UnicodeSet *)auStack_dc0._24_8_ != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet((UnicodeSet *)auStack_dc0._24_8_);
    }
    UMemory::operator_delete((UMemory *)auStack_dc0._24_8_,p);
    UnicodeString::~UnicodeString((UnicodeString *)local_e08);
    UnicodeString::~UnicodeString((UnicodeString *)(local_e50 + 8));
    if ((properties->parseNoExponent != true) || (0 < properties->minimumExponentDigits)) {
      ScientificMatcher::ScientificMatcher((ScientificMatcher *)local_e58,symbols,&local_f28);
      p_00 = &(local_f50->fLocalMatchers).scientific;
      UnicodeString::moveFrom
                (&(local_f50->fLocalMatchers).scientific.fExponentSeparatorString,
                 (UnicodeString *)local_e50);
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.requireGroupingMatch = local_e08[0];
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.groupingDisabled =
           (bool)(char)local_e08._1_7_;
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.integerOnly =
           (bool)SUB71(local_e08._1_7_,1);
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.field_0xb = SUB71(local_e08._1_7_,2);
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.grouping1 = SUB72(local_e08._1_7_,3);
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.grouping2 = SUB72(local_e08._1_7_,5);
      UnicodeString::moveFrom
                (&(local_f50->fLocalMatchers).scientific.fExponentMatcher.groupingSeparator,
                 &local_e00);
      UnicodeString::moveFrom
                (&(local_f50->fLocalMatchers).scientific.fExponentMatcher.decimalSeparator,
                 (UnicodeString *)auStack_dc0);
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.groupingUniSet =
           (UnicodeSet *)local_d98[3].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.decimalUniSet =
           (UnicodeSet *)local_d98[4].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.separatorSet =
           (UnicodeSet *)local_d98[5].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
      (local_f50->fLocalMatchers).scientific.fExponentMatcher.leadSet =
           (UnicodeSet *)local_d98[6].super_LocalPointerBase<const_icu_63::UnicodeString>.ptr;
      LocalPointer<const_icu_63::UnicodeSet>::moveFrom
                (&(local_f50->fLocalMatchers).scientific.fExponentMatcher.fLocalDecimalUniSet,
                 &local_d60);
      LocalPointer<const_icu_63::UnicodeSet>::moveFrom
                (&(local_f50->fLocalMatchers).scientific.fExponentMatcher.fLocalSeparatorSet,
                 (LocalPointer<const_icu_63::UnicodeSet> *)&local_d58);
      LocalArray<const_icu_63::UnicodeString>::moveFrom
                (&(local_f50->fLocalMatchers).scientific.fExponentMatcher.fLocalDigitStrings,
                 &local_d50);
      UnicodeString::moveFrom(&(local_f50->fLocalMatchers).scientific.fCustomMinusSign,&local_d48);
      UnicodeString::moveFrom(&(local_f50->fLocalMatchers).scientific.fCustomPlusSign,local_d08);
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(local_f50);
      local_e58 = (undefined1  [8])&PTR__ScientificMatcher_003d7e28;
      UnicodeString::~UnicodeString(local_d08);
      UnicodeString::~UnicodeString(&local_d48);
      local_e10 = &PTR__DecimalMatcher_003d9060;
      LocalArray<const_icu_63::UnicodeString>::~LocalArray(&local_d50);
      if ((UnicodeSet *)local_d58._vptr_NumberParseMatcher != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet((UnicodeSet *)local_d58._vptr_NumberParseMatcher);
      }
      UMemory::operator_delete((UMemory *)local_d58._vptr_NumberParseMatcher,p_00);
      if (local_d60.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet
                  ((UnicodeSet *)local_d60.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr);
      }
      UMemory::operator_delete
                ((UMemory *)local_d60.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr,p_00);
      UnicodeString::~UnicodeString((UnicodeString *)auStack_dc0);
      UnicodeString::~UnicodeString(&local_e00);
      UnicodeString::~UnicodeString((UnicodeString *)local_e50);
    }
    (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
              (local_f50,&(local_f50->fLocalValidators).number);
    if (bVar4 != 0) {
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (local_f50,&local_f50->fLocalValidators);
    }
    if (parseCurrency) {
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (local_f50,&(local_f50->fLocalValidators).currency);
    }
    if (properties->decimalPatternMatchRequired == true) {
      RequireDecimalSeparatorValidator::RequireDecimalSeparatorValidator
                ((RequireDecimalSeparatorValidator *)local_e58,
                 (bool)(properties->maximumFractionDigits != 0 |
                       properties->decimalSeparatorAlwaysShown));
      (local_f50->fLocalValidators).decimalSeparator.fPatternHasDecimalSeparator = local_e50[0];
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (local_f50,&(local_f50->fLocalValidators).decimalSeparator);
    }
    iVar7 = properties->multiplier;
    power = properties->multiplierScale + properties->magnitudeMultiplier;
    if (iVar7 == 1 || power == 0) {
      if (power == 0) {
        if (iVar7 == 1) {
          icu_63::number::Scale::none();
        }
        else {
          icu_63::number::Scale::byDouble(&local_f08,(double)iVar7);
        }
      }
      else {
        icu_63::number::Scale::powerOfTen(power);
      }
    }
    else {
      icu_63::number::Scale::byDoubleAndPowerOfTen(&local_f08,(double)iVar7,power);
    }
    if ((local_f08.fMagnitude != 0) || (local_f08.fArbitrary != (DecNum *)0x0)) {
      icu_63::number::Scale::Scale(&local_ef0,&local_f08);
      MultiplierParseHandler::MultiplierParseHandler((MultiplierParseHandler *)local_e58,&local_ef0)
      ;
      icu_63::number::Scale::operator=
                (&(local_f50->fLocalValidators).multiplier.fMultiplier,(Scale *)local_e50);
      (*(local_f50->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (local_f50,&(local_f50->fLocalValidators).multiplier);
      local_e58 = (undefined1  [8])&PTR__MultiplierParseHandler_003d8300;
      icu_63::number::Scale::~Scale((Scale *)local_e50);
      icu_63::number::Scale::~Scale(&local_ef0);
    }
    local_f50->fFrozen = true;
    icu_63::number::Scale::~Scale(&local_f08);
    UnicodeString::~UnicodeString(&local_e98);
  }
  else {
    local_f50 = (NumberParserImpl *)0x0;
  }
  UnicodeString::~UnicodeString(&local_890.fIntlCurrencySymbol);
  UnicodeString::~UnicodeString(&local_890.fCurrencySymbol);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_890.fLocaleName.buffer);
  CurrencyUnit::~CurrencyUnit(&local_890.fCurrency);
  CurrencyUnit::~CurrencyUnit(&local_eb8);
LAB_0026ef9a:
  local_6a0.super_AffixPatternProvider._vptr_AffixPatternProvider =
       (_func_int **)&PTR__CurrencyPluralInfoAffixProvider_003d7480;
  lVar15 = 0x558;
  lVar12 = 0x560;
  lVar13 = 0x5a0;
  lVar8 = 0x5e0;
  lVar10 = 0x620;
  do {
    this_04 = (AffixPatternProvider *)((long)local_6a0.affixesByPlural + lVar15 + -8);
    this_04->_vptr_AffixPatternProvider = local_f10;
    UnicodeString::~UnicodeString((UnicodeString *)((long)local_6a0.affixesByPlural + lVar10 + -8));
    UnicodeString::~UnicodeString((UnicodeString *)((long)local_6a0.affixesByPlural + lVar8 + -8));
    UnicodeString::~UnicodeString((UnicodeString *)((long)local_6a0.affixesByPlural + lVar13 + -8));
    UnicodeString::~UnicodeString((UnicodeString *)((long)local_6a0.affixesByPlural + lVar12 + -8));
    icu_63::number::impl::AffixPatternProvider::~AffixPatternProvider(this_04);
    lVar15 = lVar15 + -0x110;
    lVar12 = lVar12 + -0x110;
    lVar13 = lVar13 + -0x110;
    lVar8 = lVar8 + -0x110;
    lVar10 = lVar10 + -0x110;
  } while (lVar15 != -0x108);
  icu_63::number::impl::AffixPatternProvider::~AffixPatternProvider
            (&local_6a0.super_AffixPatternProvider);
  local_9a0._0_8_ = local_f10;
  UnicodeString::~UnicodeString(&local_8d8);
  UnicodeString::~UnicodeString(&local_918);
  UnicodeString::~UnicodeString(&local_958);
  UnicodeString::~UnicodeString((UnicodeString *)(local_9a0 + 8));
  icu_63::number::impl::AffixPatternProvider::~AffixPatternProvider
            ((AffixPatternProvider *)local_9a0);
  Locale::~Locale(&local_7a8);
  return local_f50;
}

Assistant:

NumberParserImpl*
NumberParserImpl::createParserFromProperties(const number::impl::DecimalFormatProperties& properties,
                                             const DecimalFormatSymbols& symbols, bool parseCurrency,
                                             UErrorCode& status) {
    Locale locale = symbols.getLocale();
    PropertiesAffixPatternProvider localPAPP;
    CurrencyPluralInfoAffixProvider localCPIAP;
    AffixPatternProvider* affixProvider;
    if (properties.currencyPluralInfo.fPtr.isNull()) {
        localPAPP.setTo(properties, status);
        affixProvider = &localPAPP;
    } else {
        localCPIAP.setTo(*properties.currencyPluralInfo.fPtr, properties, status);
        affixProvider = &localCPIAP;
    }
    if (affixProvider == nullptr || U_FAILURE(status)) { return nullptr; }
    CurrencyUnit currency = resolveCurrency(properties, locale, status);
    CurrencySymbols currencySymbols(currency, locale, symbols, status);
    bool isStrict = properties.parseMode.getOrDefault(PARSE_MODE_STRICT) == PARSE_MODE_STRICT;
    Grouper grouper = Grouper::forProperties(properties);
    int parseFlags = 0;
    if (affixProvider == nullptr || U_FAILURE(status)) { return nullptr; }
    if (!properties.parseCaseSensitive) {
        parseFlags |= PARSE_FLAG_IGNORE_CASE;
    }
    if (properties.parseIntegerOnly) {
        parseFlags |= PARSE_FLAG_INTEGER_ONLY;
    }
    if (properties.signAlwaysShown) {
        parseFlags |= PARSE_FLAG_PLUS_SIGN_ALLOWED;
    }
    if (isStrict) {
        parseFlags |= PARSE_FLAG_STRICT_GROUPING_SIZE;
        parseFlags |= PARSE_FLAG_STRICT_SEPARATORS;
        parseFlags |= PARSE_FLAG_USE_FULL_AFFIXES;
        parseFlags |= PARSE_FLAG_EXACT_AFFIX;
    } else {
        parseFlags |= PARSE_FLAG_INCLUDE_UNPAIRED_AFFIXES;
    }
    if (grouper.getPrimary() <= 0) {
        parseFlags |= PARSE_FLAG_GROUPING_DISABLED;
    }
    if (parseCurrency || affixProvider->hasCurrencySign()) {
        parseFlags |= PARSE_FLAG_MONETARY_SEPARATORS;
    }
    if (!parseCurrency) {
        parseFlags |= PARSE_FLAG_NO_FOREIGN_CURRENCY;
    }

    LocalPointer<NumberParserImpl> parser(new NumberParserImpl(parseFlags));

    parser->fLocalMatchers.ignorables = {
            isStrict ? unisets::STRICT_IGNORABLES : unisets::DEFAULT_IGNORABLES};
    IgnorablesMatcher& ignorables = parser->fLocalMatchers.ignorables;

    //////////////////////
    /// AFFIX MATCHERS ///
    //////////////////////

    // The following statements set up the affix matchers.
    AffixTokenMatcherSetupData affixSetupData = {
            currencySymbols, symbols, ignorables, locale, parseFlags};
    parser->fLocalMatchers.affixTokenMatcherWarehouse = {&affixSetupData};
    parser->fLocalMatchers.affixMatcherWarehouse = {&parser->fLocalMatchers.affixTokenMatcherWarehouse};
    parser->fLocalMatchers.affixMatcherWarehouse.createAffixMatchers(
            *affixProvider, *parser, ignorables, parseFlags, status);

    ////////////////////////
    /// CURRENCY MATCHER ///
    ////////////////////////

    if (parseCurrency || affixProvider->hasCurrencySign()) {
        parser->addMatcher(parser->fLocalMatchers.currency = {currencySymbols, symbols, parseFlags, status});
    }

    ///////////////
    /// PERCENT ///
    ///////////////

    // ICU-TC meeting, April 11, 2018: accept percent/permille only if it is in the pattern,
    // and to maintain regressive behavior, divide by 100 even if no percent sign is present.
    if (!isStrict && affixProvider->containsSymbolType(AffixPatternType::TYPE_PERCENT, status)) {
        parser->addMatcher(parser->fLocalMatchers.percent = {symbols});
    }
    if (!isStrict && affixProvider->containsSymbolType(AffixPatternType::TYPE_PERMILLE, status)) {
        parser->addMatcher(parser->fLocalMatchers.permille = {symbols});
    }

    ///////////////////////////////
    /// OTHER STANDARD MATCHERS ///
    ///////////////////////////////

    if (!isStrict) {
        parser->addMatcher(parser->fLocalMatchers.plusSign = {symbols, false});
        parser->addMatcher(parser->fLocalMatchers.minusSign = {symbols, false});
    }
    parser->addMatcher(parser->fLocalMatchers.nan = {symbols});
    parser->addMatcher(parser->fLocalMatchers.infinity = {symbols});
    UnicodeString padString = properties.padString;
    if (!padString.isBogus() && !ignorables.getSet()->contains(padString)) {
        parser->addMatcher(parser->fLocalMatchers.padding = {padString});
    }
    parser->addMatcher(parser->fLocalMatchers.ignorables);
    parser->addMatcher(parser->fLocalMatchers.decimal = {symbols, grouper, parseFlags});
    // NOTE: parseNoExponent doesn't disable scientific parsing if we have a scientific formatter
    if (!properties.parseNoExponent || properties.minimumExponentDigits > 0) {
        parser->addMatcher(parser->fLocalMatchers.scientific = {symbols, grouper});
    }

    //////////////////
    /// VALIDATORS ///
    //////////////////

    parser->addMatcher(parser->fLocalValidators.number = {});
    if (isStrict) {
        parser->addMatcher(parser->fLocalValidators.affix = {});
    }
    if (parseCurrency) {
        parser->addMatcher(parser->fLocalValidators.currency = {});
    }
    if (properties.decimalPatternMatchRequired) {
        bool patternHasDecimalSeparator =
                properties.decimalSeparatorAlwaysShown || properties.maximumFractionDigits != 0;
        parser->addMatcher(parser->fLocalValidators.decimalSeparator = {patternHasDecimalSeparator});
    }
    // The multiplier takes care of scaling percentages.
    Scale multiplier = scaleFromProperties(properties);
    if (multiplier.isValid()) {
        parser->addMatcher(parser->fLocalValidators.multiplier = {multiplier});
    }

    parser->freeze();
    return parser.orphan();
}